

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp-conf.c
# Opt level: O1

int lwsws_get_config_globals(lws_context_creation_info *info,char *d,char **cs,int *len)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  int iVar5;
  char **ppcVar6;
  lws_dir_args da;
  char dd [128];
  lws_context_creation_info *local_1b8 [5];
  char **local_190;
  char *local_188;
  undefined1 local_180;
  char **local_e8;
  uint local_e0;
  byte local_dc;
  lws_context_creation_info **local_d8;
  char **local_d0;
  undefined4 local_c8;
  code *local_c0;
  char local_b8 [136];
  
  ppcVar6 = info->plugin_dirs;
  memset(local_1b8,0,0xe0);
  local_190 = (char **)*cs;
  local_188 = (char *)((long)local_190 + (long)*len + -1);
  local_180 = 0;
  if (((ulong)local_190 & 0xf) != 0) {
    local_190 = (char **)((long)local_190 + (0x10 - ((ulong)local_190 & 0xf)));
  }
  local_dc = local_dc & 0xef;
  info->plugin_dirs = local_190;
  local_e8 = local_190;
  if (ppcVar6 != (char **)0x0) {
    uVar3 = (ulong)local_e0;
    pcVar4 = *ppcVar6;
    if (pcVar4 != (char *)0x0) {
      uVar3 = (ulong)(int)local_e0;
      do {
        ppcVar6 = ppcVar6 + 1;
        local_190[uVar3] = pcVar4;
        uVar3 = uVar3 + 1;
        pcVar4 = *ppcVar6;
      } while (pcVar4 != (char *)0x0);
    }
    local_e0 = (uint)uVar3;
  }
  local_1b8[0] = info;
  local_190 = local_190 + 10;
  lws_snprintf(local_b8,0x7f,"%s/conf",d);
  uVar1 = lwsws_get_config(local_1b8,local_b8,paths_global,0xf,lejp_globals_cb);
  iVar5 = 1;
  if (uVar1 < 2) {
    lws_snprintf(local_b8,0x7f,"%s/conf.d",d);
    local_d0 = paths_global;
    local_c8 = 0xf;
    local_c0 = lejp_globals_cb;
    local_d8 = local_1b8;
    iVar2 = lws_dir(local_b8,&local_d8,lwsws_get_config_d_cb);
    if (iVar2 < 2) {
      local_e8[(int)local_e0] = (char *)0x0;
      *cs = (char *)local_190;
      *len = (int)local_188 - (int)local_190;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int
lwsws_get_config_globals(struct lws_context_creation_info *info, const char *d,
			 char **cs, int *len)
{
	struct lws_dir_args da;
	struct jpargs a;
	const char * const *old = info->plugin_dirs;
	char dd[128];

	memset(&a, 0, sizeof(a));

	a.info = info;
	a.p = *cs;
	a.end = (a.p + *len) - 1;
	a.valid = 0;

	lwsws_align(&a);
	info->plugin_dirs = (void *)a.p;
	a.plugin_dirs = (void *)a.p; /* writeable version */
	a.p += MAX_PLUGIN_DIRS * sizeof(void *);

	/* copy any default paths */

	while (old && *old) {
		a.plugin_dirs[a.count_plugin_dirs++] = *old;
		old++;
	}

	lws_snprintf(dd, sizeof(dd) - 1, "%s/conf", d);
	if (lwsws_get_config(&a, dd, paths_global,
			     LWS_ARRAY_SIZE(paths_global), lejp_globals_cb) > 1)
		return 1;
	lws_snprintf(dd, sizeof(dd) - 1, "%s/conf.d", d);

	da.user = &a;
	da.paths = paths_global;
	da.count_paths = LWS_ARRAY_SIZE(paths_global),
	da.cb = lejp_globals_cb;

	if (lws_dir(dd, &da, lwsws_get_config_d_cb) > 1)
		return 1;

	a.plugin_dirs[a.count_plugin_dirs] = NULL;

	*cs = a.p;
	*len = lws_ptr_diff(a.end, a.p);

	return 0;
}